

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChContactSurfaceMesh::SurfaceSyncCollisionModels(ChContactSurfaceMesh *this)

{
  pointer psVar1;
  pointer psVar2;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    psVar1 = (this->vfaces).
             super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vfaces).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZ>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)uVar3) break;
    (**(code **)((long)(psVar1[uVar3].
                        super___shared_ptr<chrono::fea::ChContactTriangleXYZ,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->collision_model->_vptr_ChCollisionModel + 0xc0))();
    uVar3 = uVar3 + 1;
  }
  uVar3 = 0;
  while( true ) {
    psVar2 = (this->vfaces_rot).
             super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vfaces_rot).
                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>,_std::allocator<std::shared_ptr<chrono::fea::ChContactTriangleXYZROT>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <=
        (ulong)uVar3) break;
    (**(code **)((long)(psVar2[uVar3].
                        super___shared_ptr<chrono::fea::ChContactTriangleXYZROT,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->collision_model->_vptr_ChCollisionModel + 0xc0))();
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void ChContactSurfaceMesh::SurfaceSyncCollisionModels() {
    for (unsigned int j = 0; j < vfaces.size(); j++) {
        vfaces[j]->GetCollisionModel()->SyncPosition();
    }
    for (unsigned int j = 0; j < vfaces_rot.size(); j++) {
        vfaces_rot[j]->GetCollisionModel()->SyncPosition();
    }
}